

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_inl.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>::CopyIterator
          (TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,
          MapIterator *this_iter,MapIterator *that_iter)

{
  const_iterator *pcVar1;
  const_iterator *pcVar2;
  CppType type;
  MapIterator *in_RDX;
  MapIterator *in_RSI;
  MapKey *in_RDI;
  
  pcVar1 = InternalGetIterator((TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                *)in_RDI,in_RDX);
  pcVar2 = InternalGetIterator((TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                *)in_RDI,in_RSI);
  (pcVar2->it_).node_ = (pcVar1->it_).node_;
  (pcVar2->it_).m_ = (pcVar1->it_).m_;
  (pcVar2->it_).bucket_index_ = (pcVar1->it_).bucket_index_;
  type = (CppType)((ulong)&in_RSI->key_ >> 0x20);
  MapKey::type((MapKey *)this);
  MapKey::SetType(in_RDI,type);
  MapValueRef::SetType(&in_RSI->value_,(in_RDX->value_).type_);
  (**(code **)((in_RDI->val_).int64_value_ + 0xa8))(in_RDI,in_RSI);
  return;
}

Assistant:

void TypeDefinedMapFieldBase<Key, T>::CopyIterator(
    MapIterator* this_iter, const MapIterator& that_iter) const {
  InternalGetIterator(this_iter) = InternalGetIterator(&that_iter);
  this_iter->key_.SetType(that_iter.key_.type());
  // MapValueRef::type() fails when containing data is null. However, if
  // this_iter points to MapEnd, data can be null.
  this_iter->value_.SetType(
      static_cast<FieldDescriptor::CppType>(that_iter.value_.type_));
  SetMapIteratorValue(this_iter);
}